

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::InvocationInterlockPlacementPass::addInstructionAtBlockBoundary
          (InvocationInterlockPlacementPass *this,BasicBlock *block,Op opcode,bool at_end)

{
  Op OVar1;
  uint __line;
  Function *in_RAX;
  Instruction *pIVar2;
  undefined7 in_register_00000009;
  char *__assertion;
  Function *local_28;
  
  OVar1 = ((block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_)->opcode_;
  if ((int)CONCAT71(in_register_00000009,at_end) == 0) {
    if (OVar1 != OpPhi) {
      pIVar2 = (Instruction *)operator_new(0x70);
      Instruction::Instruction(pIVar2,(this->super_Pass).context_,opcode);
      utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
                ((IntrusiveNodeBase<spvtools::opt::Instruction> *)pIVar2,
                 (block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_);
      return;
    }
    __assertion = 
    "block->begin()->opcode() != spv::Op::OpPhi && \"addInstructionAtBlockBoundary expects to be called with at_end == \" \"false only if there is a single predecessor to block\""
    ;
    __line = 0x5a;
  }
  else {
    if (OVar1 != OpPhi) {
      local_28 = in_RAX;
      pIVar2 = (Instruction *)operator_new(0x70);
      Instruction::Instruction(pIVar2,(this->super_Pass).context_,opcode);
      BasicBlock::tail((BasicBlock *)&stack0xffffffffffffffd8);
      local_28 = (Function *)
                 (local_28->params_).
                 super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertAfter
                ((IntrusiveNodeBase<spvtools::opt::Instruction> *)pIVar2,(Instruction *)local_28);
      return;
    }
    __assertion = 
    "block->begin()->opcode() != spv::Op::OpPhi && \"addInstructionAtBlockBoundary expects to be called with at_end == \" \"true only if there is a single successor to block\""
    ;
    __line = 0x53;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp"
                ,__line,
                "void spvtools::opt::InvocationInterlockPlacementPass::addInstructionAtBlockBoundary(BasicBlock *, spv::Op, bool)"
               );
}

Assistant:

void InvocationInterlockPlacementPass::addInstructionAtBlockBoundary(
    BasicBlock* block, spv::Op opcode, bool at_end) {
  if (at_end) {
    assert(block->begin()->opcode() != spv::Op::OpPhi &&
           "addInstructionAtBlockBoundary expects to be called with at_end == "
           "true only if there is a single successor to block");
    // Insert a begin instruction at the end of the block.
    Instruction* begin_inst = new Instruction(context(), opcode);
    begin_inst->InsertAfter(&*--block->tail());
  } else {
    assert(block->begin()->opcode() != spv::Op::OpPhi &&
           "addInstructionAtBlockBoundary expects to be called with at_end == "
           "false only if there is a single predecessor to block");
    // Insert an end instruction at the beginning of the block.
    Instruction* end_inst = new Instruction(context(), opcode);
    end_inst->InsertBefore(&*block->begin());
  }
}